

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source-map.cpp
# Opt level: O3

void __thiscall wasm::SourceMapReader::parse(SourceMapReader *this,Module *wasm)

{
  char **ppcVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  Value *pVVar3;
  pointer pRVar4;
  int *piVar5;
  element_type *peVar6;
  char *pcVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__s;
  SourceMapReader *pSVar8;
  bool bVar9;
  int32_t iVar10;
  Ref *pRVar11;
  size_t sVar12;
  void *__ptr;
  size_t sVar13;
  string *psVar14;
  undefined1 in_CL;
  char reuse;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  ulong uVar16;
  int *piVar17;
  undefined *puVar18;
  char *pcVar19;
  ulong uVar20;
  string *psVar21;
  string_view sVar22;
  undefined1 *local_1f0;
  long local_1e8;
  undefined1 local_1e0 [16];
  undefined1 *local_1d0;
  long local_1c8;
  undefined1 local_1c0 [16];
  undefined1 *local_1b0;
  long local_1a8;
  undefined1 local_1a0 [16];
  undefined1 *local_190;
  long local_188;
  undefined1 local_180 [16];
  undefined1 *local_170;
  long local_168;
  undefined1 local_160 [16];
  undefined1 *local_150;
  long local_148;
  undefined1 local_140 [16];
  undefined1 *local_130;
  long local_128;
  undefined1 local_120 [16];
  undefined1 *local_110;
  long local_108;
  undefined1 local_100 [16];
  undefined1 *local_f0;
  long local_e8;
  undefined1 local_e0 [16];
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  SourceMapReader *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  Module *local_80;
  undefined1 local_78 [8];
  Value json;
  JsonParseException jx;
  allocator<char> local_31;
  
  pcVar19 = (this->buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (pcVar19 ==
      (this->buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    return;
  }
  local_78._0_4_ = Null;
  json.type = String;
  json._4_4_ = 0;
  local_80 = wasm;
  ::json::Value::parse((Value *)local_78,pcVar19,ASCII);
  if (local_78._0_4_ != Object) {
    psVar14 = (string *)__cxa_allocate_exception(0x20);
    local_1f0 = local_1e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f0,"Source map is not valid JSON","");
    *(string **)psVar14 = psVar14 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar14,local_1f0,local_1f0 + local_1e8);
    __cxa_throw(psVar14,&MapParseException::typeinfo,MapParseException::~MapParseException);
  }
  sVar22 = IString::interned((IString *)0x7,(string_view)ZEXT816(0xe31297),(bool)in_CL);
  bVar9 = ::json::Value::has((Value *)local_78,(IString)sVar22);
  if (bVar9) {
    sVar22 = IString::interned((IString *)0x7,(string_view)ZEXT816(0xe31297),(bool)in_CL);
    pRVar11 = ::json::Value::operator[]((Value *)local_78,(IString)sVar22);
    if (((pRVar11->super_shared_ptr<json::Value>).
         super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type == Number) {
      sVar22 = IString::interned((IString *)0x7,(string_view)ZEXT816(0xe31297),(bool)in_CL);
      pRVar11 = ::json::Value::operator[]((Value *)local_78,(IString)sVar22);
      iVar10 = ::json::Value::getInteger
                         ((pRVar11->super_shared_ptr<json::Value>).
                          super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      if (iVar10 == 3) {
        sVar22 = IString::interned((IString *)0x7,(string_view)ZEXT816(0xe2df73),(bool)in_CL);
        bVar9 = ::json::Value::has((Value *)local_78,(IString)sVar22);
        if (bVar9) {
          sVar22 = IString::interned((IString *)0x7,(string_view)ZEXT816(0xe2df73),(bool)in_CL);
          pRVar11 = ::json::Value::operator[]((Value *)local_78,(IString)sVar22);
          if (((pRVar11->super_shared_ptr<json::Value>).
               super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type == Array) {
            sVar22 = IString::interned((IString *)0x7,(string_view)ZEXT816(0xe2df73),(bool)in_CL);
            pRVar11 = ::json::Value::operator[]((Value *)local_78,(IString)sVar22);
            pVVar3 = (pRVar11->super_shared_ptr<json::Value>).
                     super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            p_Var15 = (pRVar11->super_shared_ptr<json::Value>).
                      super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
              }
            }
            local_90 = this;
            local_88 = p_Var15;
            sVar12 = ::json::Value::size(pVVar3);
            reuse = (char)p_Var15;
            if (sVar12 != 0) {
              pvVar2 = &local_80->debugInfoFileNames;
              uVar20 = 0;
              ppcVar1 = &json.field_1.str.str._M_str;
              do {
                if (pVVar3->type != Array) goto LAB_00c53ddd;
                uVar16 = uVar20 & 0xffffffff;
                pRVar4 = (((pVVar3->field_1).arr)->
                         super__Vector_base<json::Value::Ref,_std::allocator<json::Value::Ref>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                piVar5 = (int *)pRVar4[uVar16].super_shared_ptr<json::Value>.
                                super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                p_Var15 = pRVar4[uVar16].super_shared_ptr<json::Value>.
                          super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi;
                if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
                    UNLOCK();
                    if (pVVar3->type != Array) goto LAB_00c53ddd;
                  }
                  else {
                    p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
                  }
                }
                piVar17 = (int *)(((pVVar3->field_1).arr)->
                                 super__Vector_base<json::Value::Ref,_std::allocator<json::Value::Ref>_>
                                 )._M_impl.super__Vector_impl_data._M_start[uVar16].
                                 super_shared_ptr<json::Value>.
                                 super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                if (*piVar17 != 0) {
                  psVar14 = (string *)__cxa_allocate_exception(0x20);
                  local_190 = local_180;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_190,"Source map sources contains non-string","");
                  *(string **)psVar14 = psVar14 + 0x10;
                  std::__cxx11::string::_M_construct<char*>(psVar14,local_190,local_190 + local_188)
                  ;
                  __cxa_throw(psVar14,&MapParseException::typeinfo,
                              MapParseException::~MapParseException);
                }
                if (*piVar5 != 0) goto LAB_00c53dfc;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)ppcVar1,*(char **)(piVar5 + 4),&local_31);
                reuse = (char)piVar17;
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           pvVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)ppcVar1);
                if (json.field_1._8_8_ != &jx.errorText._M_string_length) {
                  operator_delete(json.field_1.str.str._M_str,jx.errorText._M_string_length + 1);
                }
                if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
                }
                uVar20 = uVar20 + 1;
                sVar12 = ::json::Value::size(pVVar3);
              } while (uVar20 < sVar12);
            }
            sVar22 = IString::interned((IString *)0xe,(string_view)ZEXT816(0xe2dfcd),(bool)reuse);
            bVar9 = ::json::Value::has((Value *)local_78,(IString)sVar22);
            if (bVar9) {
              sVar22 = IString::interned((IString *)0xe,(string_view)ZEXT816(0xe2dfcd),(bool)reuse);
              pRVar11 = ::json::Value::operator[]((Value *)local_78,(IString)sVar22);
              pVVar3 = (pRVar11->super_shared_ptr<json::Value>).
                       super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              p_Var15 = (pRVar11->super_shared_ptr<json::Value>).
                        super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi;
              if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
                }
              }
              jx.errorText.field_2._8_8_ = p_Var15;
              if (pVVar3->type != Array) {
                psVar14 = (string *)__cxa_allocate_exception(0x20);
                local_170 = local_160;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_170,"Source map sourcesContent is not an array","");
                *(string **)psVar14 = psVar14 + 0x10;
                std::__cxx11::string::_M_construct<char*>(psVar14,local_170,local_170 + local_168);
                __cxa_throw(psVar14,&MapParseException::typeinfo,
                            MapParseException::~MapParseException);
              }
              sVar12 = ::json::Value::size(pVVar3);
              reuse = (char)p_Var15;
              if (sVar12 != 0) {
                pvVar2 = &local_80->debugInfoSourcesContent;
                uVar20 = 0;
                ppcVar1 = &json.field_1.str.str._M_str;
                do {
                  if (pVVar3->type != Array) goto LAB_00c53ddd;
                  reuse = (char)(uVar20 & 0xffffffff) * '\x10';
                  piVar5 = (int *)(((pVVar3->field_1).arr)->
                                  super__Vector_base<json::Value::Ref,_std::allocator<json::Value::Ref>_>
                                  )._M_impl.super__Vector_impl_data._M_start[uVar20 & 0xffffffff].
                                  super_shared_ptr<json::Value>.
                                  super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  ;
                  if (*piVar5 != 0) {
LAB_00c53dfc:
                    __assert_fail("isString()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/json.h"
                                  ,0xbe,"const char *json::Value::getCString()");
                  }
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)ppcVar1,*(char **)(piVar5 + 4),&local_31);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             pvVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)ppcVar1);
                  if (json.field_1._8_8_ != &jx.errorText._M_string_length) {
                    operator_delete(json.field_1.str.str._M_str,jx.errorText._M_string_length + 1);
                  }
                  uVar20 = uVar20 + 1;
                  sVar12 = ::json::Value::size(pVVar3);
                } while (uVar20 < sVar12);
              }
              if (jx.errorText.field_2._8_8_ != 0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           jx.errorText.field_2._8_8_);
              }
            }
            sVar22 = IString::interned((IString *)0x5,(string_view)ZEXT816(0xdc4ca7),(bool)reuse);
            bVar9 = ::json::Value::has((Value *)local_78,(IString)sVar22);
            if (bVar9) {
              sVar22 = IString::interned((IString *)0x5,(string_view)ZEXT816(0xdc4ca7),(bool)reuse);
              pRVar11 = ::json::Value::operator[]((Value *)local_78,(IString)sVar22);
              pVVar3 = (pRVar11->super_shared_ptr<json::Value>).
                       super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              p_Var15 = (pRVar11->super_shared_ptr<json::Value>).
                        super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi;
              if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
                }
              }
              jx.errorText.field_2._8_8_ = p_Var15;
              if (pVVar3->type != Array) {
                psVar14 = (string *)__cxa_allocate_exception(0x20);
                local_150 = local_140;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_150,"Source map names is not an array","");
                *(string **)psVar14 = psVar14 + 0x10;
                std::__cxx11::string::_M_construct<char*>(psVar14,local_150,local_150 + local_148);
                __cxa_throw(psVar14,&MapParseException::typeinfo,
                            MapParseException::~MapParseException);
              }
              sVar12 = ::json::Value::size(pVVar3);
              reuse = (char)p_Var15;
              if (sVar12 != 0) {
                pvVar2 = &local_80->debugInfoSymbolNames;
                uVar20 = 0;
                ppcVar1 = &json.field_1.str.str._M_str;
                do {
                  if (pVVar3->type != Array) {
LAB_00c53ddd:
                    __assert_fail("isArray()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/json.h"
                                  ,0x197,"Ref &json::Value::operator[](unsigned int)");
                  }
                  pRVar4 = (((pVVar3->field_1).arr)->
                           super__Vector_base<json::Value::Ref,_std::allocator<json::Value::Ref>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  puVar18 = (undefined *)((uVar20 & 0xffffffff) * 0x10);
                  piVar5 = *(int **)(puVar18 + (long)pRVar4);
                  p_Var15 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                             (puVar18 +
                             (long)&(pRVar4->super_shared_ptr<json::Value>).
                                    super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount);
                  if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    puVar18 = &__libc_single_threaded;
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
                    }
                  }
                  reuse = (char)puVar18;
                  if (*piVar5 != 0) {
                    psVar14 = (string *)__cxa_allocate_exception(0x20);
                    local_130 = local_120;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_130,"Source map names contains non-string","");
                    *(string **)psVar14 = psVar14 + 0x10;
                    std::__cxx11::string::_M_construct<char*>
                              (psVar14,local_130,local_130 + local_128);
                    __cxa_throw(psVar14,&MapParseException::typeinfo,
                                MapParseException::~MapParseException);
                  }
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)ppcVar1,*(char **)(piVar5 + 4),&local_31);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             pvVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)ppcVar1);
                  if (json.field_1._8_8_ != &jx.errorText._M_string_length) {
                    operator_delete(json.field_1.str.str._M_str,jx.errorText._M_string_length + 1);
                  }
                  if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
                  }
                  uVar20 = uVar20 + 1;
                  sVar12 = ::json::Value::size(pVVar3);
                } while (uVar20 < sVar12);
              }
              if (jx.errorText.field_2._8_8_ != 0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           jx.errorText.field_2._8_8_);
              }
            }
            sVar22 = IString::interned((IString *)0xa,(string_view)ZEXT816(0xe2e04c),(bool)reuse);
            bVar9 = ::json::Value::has((Value *)local_78,(IString)sVar22);
            if (bVar9) {
              sVar22 = IString::interned((IString *)0xa,(string_view)ZEXT816(0xe2e04c),(bool)reuse);
              pRVar11 = ::json::Value::operator[]((Value *)local_78,(IString)sVar22);
              peVar6 = (pRVar11->super_shared_ptr<json::Value>).
                       super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              p_Var15 = (pRVar11->super_shared_ptr<json::Value>).
                        super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi;
              if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
                }
              }
              if (peVar6->type != String) {
                psVar14 = (string *)__cxa_allocate_exception(0x20);
                local_110 = local_100;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_110,"Source map sourceRoot is not a string","");
                *(string **)psVar14 = psVar14 + 0x10;
                std::__cxx11::string::_M_construct<char*>(psVar14,local_110,local_110 + local_108);
                __cxa_throw(psVar14,&MapParseException::typeinfo,
                            MapParseException::~MapParseException);
              }
              pcVar19 = (peVar6->field_1).str.str._M_str;
              psVar21 = &local_80->debugInfoSourceRoot;
              pcVar7 = (char *)(local_80->debugInfoSourceRoot)._M_string_length;
              strlen(pcVar19);
              std::__cxx11::string::_M_replace((ulong)psVar21,0,pcVar7,(ulong)pcVar19);
              reuse = (char)pcVar19;
              if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
              }
            }
            sVar22 = IString::interned((IString *)0x4,(string_view)ZEXT816(0xe55548),(bool)reuse);
            bVar9 = ::json::Value::has((Value *)local_78,(IString)sVar22);
            if (bVar9) {
              sVar22 = IString::interned((IString *)0x4,(string_view)ZEXT816(0xe55548),(bool)reuse);
              pRVar11 = ::json::Value::operator[]((Value *)local_78,(IString)sVar22);
              peVar6 = (pRVar11->super_shared_ptr<json::Value>).
                       super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              p_Var15 = (pRVar11->super_shared_ptr<json::Value>).
                        super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi;
              if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
                }
              }
              if (peVar6->type != String) {
                psVar14 = (string *)__cxa_allocate_exception(0x20);
                local_f0 = local_e0;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_f0,"Source map file is not a string","");
                *(string **)psVar14 = psVar14 + 0x10;
                std::__cxx11::string::_M_construct<char*>(psVar14,local_f0,local_f0 + local_e8);
                __cxa_throw(psVar14,&MapParseException::typeinfo,
                            MapParseException::~MapParseException);
              }
              pcVar19 = (peVar6->field_1).str.str._M_str;
              pcVar7 = (char *)(local_80->debugInfoFile)._M_string_length;
              psVar21 = &local_80->debugInfoFile;
              strlen(pcVar19);
              std::__cxx11::string::_M_replace((ulong)psVar21,0,pcVar7,(ulong)pcVar19);
              reuse = (char)pcVar19;
              if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
              }
            }
            sVar22 = IString::interned((IString *)&DAT_00000008,(string_view)ZEXT816(0xe2e09d),
                                       (bool)reuse);
            bVar9 = ::json::Value::has((Value *)local_78,(IString)sVar22);
            if (!bVar9) {
              psVar14 = (string *)__cxa_allocate_exception(0x20);
              local_d0 = local_c0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_d0,"Source map mappings missing","");
              *(string **)psVar14 = psVar14 + 0x10;
              std::__cxx11::string::_M_construct<char*>(psVar14,local_d0,local_d0 + local_c8);
              __cxa_throw(psVar14,&MapParseException::typeinfo,MapParseException::~MapParseException
                         );
            }
            sVar22 = IString::interned((IString *)&DAT_00000008,(string_view)ZEXT816(0xe2e09d),
                                       (bool)reuse);
            __ptr = (void *)sVar22._M_len;
            pRVar11 = ::json::Value::operator[]((Value *)local_78,(IString)sVar22);
            peVar6 = (pRVar11->super_shared_ptr<json::Value>).
                     super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            p_Var15 = (pRVar11->super_shared_ptr<json::Value>).
                      super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
              }
            }
            if (peVar6->type == String) {
              __s = (peVar6->field_1).ref.super_shared_ptr<json::Value>.
                    super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
              sVar13 = strlen((char *)__s);
              pSVar8 = local_90;
              (local_90->mappings)._M_len = sVar13;
              (local_90->mappings)._M_str = (char *)__s;
              if (sVar13 == 0) {
                sVar12 = 0;
              }
              else {
                iVar10 = readBase64VLQ(local_90);
                sVar12 = (size_t)iVar10;
              }
              pSVar8->location = sVar12;
              if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
              }
              if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
              }
              ::json::Value::free((Value *)local_78,__ptr);
              return;
            }
            psVar14 = (string *)__cxa_allocate_exception(0x20);
            local_b0 = local_a0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b0,"Source map mappings is not a string","");
            *(string **)psVar14 = psVar14 + 0x10;
            std::__cxx11::string::_M_construct<char*>(psVar14,local_b0,local_b0 + local_a8);
            __cxa_throw(psVar14,&MapParseException::typeinfo,MapParseException::~MapParseException);
          }
        }
        psVar14 = (string *)__cxa_allocate_exception(0x20);
        local_1b0 = local_1a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1b0,"Source map sources missing or not an array","");
        *(string **)psVar14 = psVar14 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar14,local_1b0,local_1b0 + local_1a8);
        __cxa_throw(psVar14,&MapParseException::typeinfo,MapParseException::~MapParseException);
      }
    }
  }
  psVar14 = (string *)__cxa_allocate_exception(0x20);
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d0,"Source map version missing or is not 3","");
  *(string **)psVar14 = psVar14 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar14,local_1d0,local_1d0 + local_1c8);
  __cxa_throw(psVar14,&MapParseException::typeinfo,MapParseException::~MapParseException);
}

Assistant:

void SourceMapReader::parse(Module& wasm) {
  if (buffer.empty()) {
    return;
  }
  json::Value json;
  try {
    json.parse(buffer.data(), json::Value::ASCII);
  } catch (json::JsonParseException jx) {
    throw MapParseException(jx);
  }
  if (!json.isObject()) {
    throw MapParseException("Source map is not valid JSON");
  }
  if (!(json.has("version") && json["version"]->isNumber() &&
        json["version"]->getInteger() == 3)) {
    throw MapParseException("Source map version missing or is not 3");
  }
  if (!(json.has("sources") && json["sources"]->isArray())) {
    throw MapParseException("Source map sources missing or not an array");
  }
  json::Ref s = json["sources"];
  for (size_t i = 0; i < s->size(); i++) {
    json::Ref v = s[i];
    if (!(s[i]->isString())) {
      throw MapParseException("Source map sources contains non-string");
    }
    wasm.debugInfoFileNames.push_back(v->getCString());
  }

  if (json.has("sourcesContent")) {
    json::Ref sc = json["sourcesContent"];
    if (!sc->isArray()) {
      throw MapParseException("Source map sourcesContent is not an array");
    }
    for (size_t i = 0; i < sc->size(); i++) {
      wasm.debugInfoSourcesContent.push_back(sc[i]->getCString());
    }
  }

  if (json.has("names")) {
    json::Ref n = json["names"];
    if (!n->isArray()) {
      throw MapParseException("Source map names is not an array");
    }
    for (size_t i = 0; i < n->size(); i++) {
      json::Ref v = n[i];
      if (!v->isString()) {
        throw MapParseException("Source map names contains non-string");
      }
      wasm.debugInfoSymbolNames.push_back(v->getCString());
    }
  }

  if (json.has("sourceRoot")) {
    json::Ref sr = json["sourceRoot"];
    if (!sr->isString()) {
      throw MapParseException("Source map sourceRoot is not a string");
    }
    wasm.debugInfoSourceRoot = sr->getCString();
  }

  if (json.has("file")) {
    json::Ref f = json["file"];
    if (!f->isString()) {
      throw MapParseException("Source map file is not a string");
    }
    wasm.debugInfoFile = f->getCString();
  }

  if (!json.has("mappings")) {
    throw MapParseException("Source map mappings missing");
  }
  json::Ref m = json["mappings"];
  if (!m->isString()) {
    throw MapParseException("Source map mappings is not a string");
  }

  mappings = m->getCString();
  if (mappings.empty()) {
    // There are no mappings.
    location = 0;
    return;
  }

  // Read the location of the first debug location.
  location = readBase64VLQ();
}